

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

ssize_t Bcj2_Decode(_7zip *zip,uint8_t *outBuf,size_t outSize)

{
  ushort uVar1;
  long lVar2;
  long lVar3;
  ulong in_RDX;
  size_t sVar4;
  long in_RSI;
  long in_RDI;
  uint8_t *buf1;
  uint8_t *buf0;
  size_t outPos;
  size_t inPos;
  undefined1 local_bc [4];
  byte *local_b8;
  int local_b0;
  byte local_a9;
  ulong local_a8;
  uint local_a0;
  uint local_9c;
  ushort *local_98;
  char local_8d;
  int local_8c;
  uint local_88;
  uint local_84;
  uint8_t *puStack_80;
  uint8_t out [4];
  uint8_t *v;
  uint32_t dest;
  uint8_t bb;
  size_t limit;
  uint32_t ttt;
  uint32_t bound;
  uint16_t *prob;
  uint8_t b;
  int ii;
  uint j;
  uint i;
  uint8_t *bufferLim;
  uint8_t *buffer;
  size_t size3;
  size_t size2;
  size_t size1;
  size_t size0;
  uint8_t *buf3;
  uint8_t *buf2;
  
  size2 = 0;
  size3 = 0;
  lVar2 = *(long *)(in_RDI + 0x4e38);
  lVar3 = (*(long *)(in_RDI + 20000) + *(long *)(in_RDI + 0x4e30)) - lVar2;
  _ttt = *(ulong *)(in_RDI + 0x4e08);
  bufferLim = (uint8_t *)((*(long *)(in_RDI + 0x4dd8) + *(long *)(in_RDI + 0x4df0)) - _ttt);
  limit = *(size_t *)(in_RDI + 0x4e10);
  _j = (byte *)((*(long *)(in_RDI + 0x4de0) + *(long *)(in_RDI + 0x4df8)) - limit);
  v = (uint8_t *)
      ((*(long *)(in_RDI + 0x4de8) + *(long *)(in_RDI + 0x4e00)) - *(long *)(in_RDI + 0x4e18));
  puStack_80 = v + *(long *)(in_RDI + 0x4e18);
  if (*(int *)(in_RDI + 0x4dac) == 0) {
    *(undefined1 *)(in_RDI + 0x5044) = 0;
    for (local_84 = 0; local_84 < 0x102; local_84 = local_84 + 1) {
      *(undefined2 *)(in_RDI + 0x4e40 + (ulong)local_84 * 2) = 0x400;
    }
    *(undefined4 *)(in_RDI + 0x504c) = 0;
    *(undefined4 *)(in_RDI + 0x5048) = 0xffffffff;
    for (local_8c = 0; local_8c < 5; local_8c = local_8c + 1) {
      if (v == puStack_80) {
        return -0x19;
      }
      *(uint *)(in_RDI + 0x504c) = *(int *)(in_RDI + 0x504c) << 8 | (uint)*v;
      v = v + 1;
    }
    *(undefined4 *)(in_RDI + 0x4dac) = 1;
  }
  local_84 = 0;
  while (*(long *)(in_RDI + 0x4db0) != 0 && size3 < in_RDX) {
    *(undefined1 *)(in_RSI + size3) = *(undefined1 *)(in_RDI + 0x4db8 + (ulong)local_84);
    *(long *)(in_RDI + 0x4db0) = *(long *)(in_RDI + 0x4db0) + -1;
    local_84 = local_84 + 1;
    size3 = size3 + 1;
  }
  if (in_RDX == 0) {
    *(size_t *)(in_RDI + 0x5050) = size3 + *(long *)(in_RDI + 0x5050);
    buf2 = (uint8_t *)size3;
  }
  else {
LAB_0024b717:
    do {
      local_a8 = lVar2 - size2;
      if (in_RDX - size3 < local_a8) {
        local_a8 = in_RDX - size3;
      }
      if (*(int *)(in_RDI + 0x4dac) == 1) {
        for (; local_a8 != 0; local_a8 = local_a8 - 1) {
          local_a9 = *(byte *)(lVar3 + size2);
          *(byte *)(in_RSI + size3) = local_a9;
          if (((local_a9 & 0xfe) == 0xe8) ||
             ((*(char *)(in_RDI + 0x5044) == '\x0f' && ((local_a9 & 0xf0) == 0x80)))) {
            *(undefined4 *)(in_RDI + 0x4dac) = 2;
            size3 = size3 + 1;
            break;
          }
          size2 = size2 + 1;
          *(byte *)(in_RDI + 0x5044) = local_a9;
          size3 = size3 + 1;
        }
      }
      if ((local_a8 == 0) || (size3 == in_RDX)) goto LAB_0024bc29;
      *(undefined4 *)(in_RDI + 0x4dac) = 1;
      sVar4 = size2 + 1;
      local_8d = *(char *)(lVar3 + size2);
      if (local_8d == -0x18) {
        local_98 = (ushort *)(in_RDI + 0x4e40 + (long)(int)(uint)*(byte *)(in_RDI + 0x5044) * 2);
      }
      else if (local_8d == -0x17) {
        local_98 = (ushort *)(in_RDI + 0x5040);
      }
      else {
        local_98 = (ushort *)(in_RDI + 0x5042);
      }
      uVar1 = *local_98;
      local_a0 = (uint)uVar1;
      local_9c = (*(uint *)(in_RDI + 0x5048) >> 0xb) * local_a0;
      size2 = sVar4;
      if (*(uint *)(in_RDI + 0x504c) < local_9c) {
        *(uint *)(in_RDI + 0x5048) = local_9c;
        *local_98 = uVar1 + (short)(0x800 - local_a0 >> 5);
        if (*(uint *)(in_RDI + 0x5048) < 0x1000000) {
          if (v == puStack_80) {
            return -0x19;
          }
          *(int *)(in_RDI + 0x5048) = *(int *)(in_RDI + 0x5048) << 8;
          *(uint *)(in_RDI + 0x504c) = *(int *)(in_RDI + 0x504c) << 8 | (uint)*v;
          v = v + 1;
        }
        *(char *)(in_RDI + 0x5044) = local_8d;
        goto LAB_0024b717;
      }
      *(uint *)(in_RDI + 0x5048) = *(int *)(in_RDI + 0x5048) - local_9c;
      *(uint *)(in_RDI + 0x504c) = *(int *)(in_RDI + 0x504c) - local_9c;
      *local_98 = uVar1 - (uVar1 >> 5);
      if (*(uint *)(in_RDI + 0x5048) < 0x1000000) {
        if (v == puStack_80) {
          return -0x19;
        }
        *(int *)(in_RDI + 0x5048) = *(int *)(in_RDI + 0x5048) << 8;
        *(uint *)(in_RDI + 0x504c) = *(int *)(in_RDI + 0x504c) << 8 | (uint)*v;
        v = v + 1;
      }
      if (local_8d == -0x18) {
        local_b8 = bufferLim;
        if (_ttt < 4) {
          return -0x19;
        }
        bufferLim = bufferLim + 4;
        _ttt = _ttt - 4;
      }
      else {
        local_b8 = _j;
        if (limit < 4) {
          return -0x19;
        }
        _j = _j + 4;
        limit = limit - 4;
      }
      local_b0 = ((uint)*local_b8 << 0x18 | (uint)local_b8[1] << 0x10 | (uint)local_b8[2] << 8 |
                 (uint)local_b8[3]) - ((int)*(undefined8 *)(in_RDI + 0x5050) + (int)size3 + 4);
      local_bc[0] = (char)local_b0;
      local_bc[1] = (char)((uint)local_b0 >> 8);
      local_bc[2] = (char)((uint)local_b0 >> 0x10);
      local_bc[3] = (undefined1)((uint)local_b0 >> 0x18);
      *(undefined1 *)(in_RDI + 0x5044) = local_bc[3];
      for (local_84 = 0; local_84 < 4 && size3 < in_RDX; local_84 = local_84 + 1) {
        *(undefined1 *)(in_RSI + size3) = local_bc[local_84];
        size3 = size3 + 1;
      }
    } while (3 < local_84);
    *(ulong *)(in_RDI + 0x4db0) = (ulong)(4 - local_84);
    for (; local_84 < 4; local_84 = local_84 + 1) {
      local_88 = (local_84 - 4) + (int)*(undefined8 *)(in_RDI + 0x4db0);
      *(undefined1 *)(in_RDI + 0x4db8 + (ulong)local_88) = local_bc[local_84];
    }
LAB_0024bc29:
    *(size_t *)(in_RDI + 0x4e38) = *(long *)(in_RDI + 0x4e38) - size2;
    *(ulong *)(in_RDI + 0x4e08) = _ttt;
    *(size_t *)(in_RDI + 0x4e10) = limit;
    *(long *)(in_RDI + 0x4e18) = (long)puStack_80 - (long)v;
    *(size_t *)(in_RDI + 0x5050) = size3 + *(long *)(in_RDI + 0x5050);
    buf2 = (uint8_t *)size3;
  }
  return (ssize_t)buf2;
}

Assistant:

static ssize_t
Bcj2_Decode(struct _7zip *zip, uint8_t *outBuf, size_t outSize)
{
	size_t inPos = 0, outPos = 0;
	const uint8_t *buf0, *buf1, *buf2, *buf3;
	size_t size0, size1, size2, size3;
	const uint8_t *buffer, *bufferLim;
	unsigned int i, j;

	size0 = zip->tmp_stream_bytes_remaining;
	buf0 = zip->tmp_stream_buff + zip->tmp_stream_bytes_avail - size0;
	size1 = zip->sub_stream_bytes_remaining[0];
	buf1 = zip->sub_stream_buff[0] + zip->sub_stream_size[0] - size1;
	size2 = zip->sub_stream_bytes_remaining[1];
	buf2 = zip->sub_stream_buff[1] + zip->sub_stream_size[1] - size2;
	size3 = zip->sub_stream_bytes_remaining[2];
	buf3 = zip->sub_stream_buff[2] + zip->sub_stream_size[2] - size3;

	buffer = buf3;
	bufferLim = buffer + size3;

	if (zip->bcj_state == 0) {
		/*
		 * Initialize.
		 */
		zip->bcj2_prevByte = 0;
		for (i = 0;
		    i < sizeof(zip->bcj2_p) / sizeof(zip->bcj2_p[0]); i++)
			zip->bcj2_p[i] = kBitModelTotal >> 1;
		RC_INIT2;
		zip->bcj_state = 1;
	}

	/*
	 * Gather the odd bytes of a previous call.
	 */
	for (i = 0; zip->odd_bcj_size > 0 && outPos < outSize; i++) {
		outBuf[outPos++] = zip->odd_bcj[i];
		zip->odd_bcj_size--;
	}

	if (outSize == 0) {
		zip->bcj2_outPos += outPos;
		return (outPos);
	}

	for (;;) {
		uint8_t b;
		CProb *prob;
		uint32_t bound;
		uint32_t ttt;

		size_t limit = size0 - inPos;
		if (outSize - outPos < limit)
			limit = outSize - outPos;

		if (zip->bcj_state == 1) {
			while (limit != 0) {
				uint8_t bb = buf0[inPos];
				outBuf[outPos++] = bb;
				if (IsJ(zip->bcj2_prevByte, bb)) {
					zip->bcj_state = 2;
					break;
				}
				inPos++;
				zip->bcj2_prevByte = bb;
				limit--;
			}
		}

		if (limit == 0 || outPos == outSize)
			break;
		zip->bcj_state = 1;

		b = buf0[inPos++];

		if (b == 0xE8)
			prob = zip->bcj2_p + zip->bcj2_prevByte;
		else if (b == 0xE9)
			prob = zip->bcj2_p + 256;
		else
			prob = zip->bcj2_p + 257;

		IF_BIT_0(prob) {
			UPDATE_0(prob)
			zip->bcj2_prevByte = b;
		} else {
			uint32_t dest;
			const uint8_t *v;
			uint8_t out[4];

			UPDATE_1(prob)
			if (b == 0xE8) {
				v = buf1;
				if (size1 < 4)
					return SZ_ERROR_DATA;
				buf1 += 4;
				size1 -= 4;
			} else {
				v = buf2;
				if (size2 < 4)
					return SZ_ERROR_DATA;
				buf2 += 4;
				size2 -= 4;
			}
			dest = (((uint32_t)v[0] << 24) |
			    ((uint32_t)v[1] << 16) |
			    ((uint32_t)v[2] << 8) |
			    ((uint32_t)v[3])) -
			    ((uint32_t)zip->bcj2_outPos + (uint32_t)outPos + 4);
			out[0] = (uint8_t)dest;
			out[1] = (uint8_t)(dest >> 8);
			out[2] = (uint8_t)(dest >> 16);
			out[3] = zip->bcj2_prevByte = (uint8_t)(dest >> 24);

			for (i = 0; i < 4 && outPos < outSize; i++)
				outBuf[outPos++] = out[i];
			if (i < 4) {
				/*
				 * Save odd bytes which we could not add into
				 * the output buffer because of out of space.
				 */
				zip->odd_bcj_size = 4 -i;
				for (; i < 4; i++) {
					j = i - 4 + (unsigned)zip->odd_bcj_size;
					zip->odd_bcj[j] = out[i];
				}
				break;
			}
		}
	}